

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

void get_yolo_detections(yolo_layer *layer,vector<detection,_std::allocator<detection>_> *detections
                        ,int im_w,int im_h,int netw,int neth,float thresh)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  yolo_layer *in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  box bVar4;
  float prob;
  int class_index;
  int j;
  int col;
  int row;
  int box_index;
  detection det;
  float objectness;
  int obj_index;
  int n;
  int i;
  vector<detection,_std::allocator<detection>_> result;
  float *predictions;
  int N;
  int h;
  int w;
  int iVar5;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  value_type in_stack_fffffffffffffee8;
  value_type in_stack_fffffffffffffeec;
  yolo_layer *layer_00;
  undefined1 in_stack_ffffffffffffff08 [16];
  int in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  box local_a8;
  vector<float,_std::allocator<float>_> local_98;
  float local_80;
  float local_70;
  int local_6c;
  int local_68;
  int local_64;
  float *local_48;
  int local_40;
  int local_3c;
  int local_38;
  float local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  yolo_layer *local_18;
  
  local_38 = in_RDI->w;
  local_3c = in_RDI->h;
  local_34 = in_XMM0_Da;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_ECX;
  local_24 = in_EDX;
  local_18 = in_RDI;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->mask);
  local_40 = (int)sVar2;
  local_48 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x10812d);
  std::vector<detection,_std::allocator<detection>_>::vector
            ((vector<detection,_std::allocator<detection>_> *)0x108142);
  for (local_64 = 0; local_64 < local_38 * local_3c; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < local_40; local_68 = local_68 + 1) {
      local_6c = yolo_layer::entry_index(local_18,local_68 * local_38 * local_3c + local_64,4);
      local_70 = local_48[local_6c];
      if (local_34 < local_70) {
        detection::detection((detection *)0x108208);
        yolo_layer::entry_index(local_18,local_68 * local_38 * local_3c + local_64,0);
        layer_00 = local_18;
        std::vector<int,_std::allocator<int>_>::operator[](&local_18->mask,(long)local_68);
        in_stack_fffffffffffffee0 = local_38 * local_3c;
        iVar5 = local_30;
        bVar4 = get_yolo_box(layer_00,(int)in_stack_fffffffffffffeec,(int)in_stack_fffffffffffffee8,
                             in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                             in_stack_fffffffffffffedc,in_stack_ffffffffffffff08._8_4_,
                             in_stack_ffffffffffffff18,(int)in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff28);
        local_a8._8_8_ = bVar4._8_8_;
        local_a8._0_8_ = bVar4._0_8_;
        in_stack_ffffffffffffff08._8_4_ = extraout_XMM0_Dc;
        in_stack_ffffffffffffff08._0_4_ = local_a8.x;
        in_stack_ffffffffffffff08._4_4_ = local_a8.y;
        in_stack_ffffffffffffff08._12_4_ = extraout_XMM0_Dd;
        correct_yolo_box(&local_a8,local_24,local_28,local_2c,local_30);
        local_80 = local_70;
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)layer_00,
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        for (in_stack_ffffffffffffff28 = 0; in_stack_ffffffffffffff28 < local_18->classes;
            in_stack_ffffffffffffff28 = in_stack_ffffffffffffff28 + 1) {
          iVar1 = yolo_layer::entry_index
                            (local_18,local_68 * local_38 * local_3c + local_64,
                             in_stack_ffffffffffffff28 + 5);
          in_stack_ffffffffffffff20 = local_70 * local_48[iVar1];
          in_stack_fffffffffffffee8 = in_stack_ffffffffffffff20;
          if (in_stack_ffffffffffffff20 <= local_34) {
            in_stack_fffffffffffffee8 = 0.0;
          }
          in_stack_fffffffffffffeec = in_stack_fffffffffffffee8;
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_98,(long)in_stack_ffffffffffffff28);
          *pvVar3 = in_stack_fffffffffffffee8;
        }
        std::vector<detection,_std::allocator<detection>_>::push_back
                  ((vector<detection,_std::allocator<detection>_> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (value_type *)CONCAT44(in_stack_fffffffffffffedc,iVar5));
        detection::~detection((detection *)0x108495);
      }
    }
  }
  std::vector<detection,_std::allocator<detection>_>::~vector
            ((vector<detection,_std::allocator<detection>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  return;
}

Assistant:

static void get_yolo_detections(const yolo_layer & layer, std::vector<detection> & detections, int im_w, int im_h, int netw, int neth, float thresh)
{
    int w = layer.w;
    int h = layer.h;
    int N = layer.mask.size();
    const float * predictions = layer.predictions.data();
    std::vector<detection> result;
    for (int i = 0; i < w*h; i++) {
        for (int n = 0; n < N; n++) {
            int obj_index = layer.entry_index(n*w*h + i, 4);
            float objectness = predictions[obj_index];
            if (objectness <= thresh) {
                continue;
            }
            detection det;
            int box_index = layer.entry_index(n*w*h + i, 0);
            int row = i / w;
            int col = i % w;
            det.bbox = get_yolo_box(layer, layer.mask[n], box_index, col, row, w, h, netw, neth, w*h);
            correct_yolo_box(det.bbox, im_w, im_h, netw, neth);
            det.objectness = objectness;
            det.prob.resize(layer.classes);
            for (int j = 0; j < layer.classes; j++) {
                int class_index = layer.entry_index(n*w*h + i, 4 + 1 + j);
                float prob = objectness*predictions[class_index];
                det.prob[j] = (prob > thresh) ? prob : 0;
            }
            detections.push_back(det);
        }
    }
}